

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O2

void bit_array_mask(void *dest,void *source,size_t offset)

{
  int iVar1;
  size_t soffset;
  ulong bit;
  
  if (source != (void *)0x0 && dest != (void *)0x0) {
    for (bit = 0; (offset + bit < *dest && (bit < *source)); bit = bit + 1) {
      iVar1 = bit_array_test(source,bit);
      if (iVar1 != 0) {
        bit_array_clear(dest,offset + bit);
      }
    }
  }
  return;
}

Assistant:

void bit_array_mask(void * dest, void * source, size_t offset)
{
	if (dest && source)
	{
		size_t * dsize = (size_t *) dest;
		size_t * ssize = (size_t *) source;
		size_t soffset = 0;
		while (offset < *dsize && soffset < *ssize)
		{
			if (bit_array_test(source, soffset))
			{
				bit_array_clear(dest, offset);
			}
			soffset++;
			offset++;
		}
	}
}